

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_> *
libtorrent::aux::parse_listen_interfaces
          (vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
           *__return_storage_ptr__,string *in,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *err)

{
  size_type sVar1;
  ulong uVar2;
  size_type sVar3;
  char *pcVar4;
  char *extraout_RDX_00;
  aux *this;
  char in_R8B;
  size_t i;
  size_t sVar5;
  undefined8 uVar6;
  string_view in_00;
  string_view in_01;
  string_view in_02;
  string_view in_03;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  string_view sVar8;
  string_view last;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  vector<libtorrent::aux::listen_interface_t,std::allocator<libtorrent::aux::listen_interface_t>>
  *local_88;
  listen_interface_t iface;
  string port_str;
  char *extraout_RDX;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = (in->_M_dataplus)._M_p;
  this = (aux *)in->_M_string_length;
  local_88 = (vector<libtorrent::aux::listen_interface_t,std::allocator<libtorrent::aux::listen_interface_t>>
              *)__return_storage_ptr__;
LAB_002cc4f7:
  if (this == (aux *)0x0) {
    return (vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
            *)local_88;
  }
  local_98 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
  last._M_str = (char *)0x2c;
  last._M_len = uVar6;
  split_string_quotes((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       *)&iface,this,last,in_R8B);
  uVar6 = iface.device.field_2._8_8_;
  local_98._M_str = (char *)iface.device._M_string_length;
  local_98._M_len = (size_t)iface.device._M_dataplus._M_p;
  this = (aux *)CONCAT71(iface.device.field_2._M_allocated_capacity._1_7_,
                         iface.device.field_2._M_local_buf[0]);
  sVar8._M_str = extraout_RDX;
  sVar8._M_len = iface.device._M_string_length;
  local_98 = (basic_string_view<char,_std::char_traits<char>_>)
             strip_string((aux *)iface.device._M_dataplus._M_p,sVar8);
  pcVar4 = local_98._M_str;
  uVar2 = local_98._M_len;
  if (uVar2 < 2) goto LAB_002cc571;
  if ((*pcVar4 == '\"') && (pcVar4[uVar2 - 1] == '\"')) {
    local_98 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_98,1,uVar2 - 2);
    goto LAB_002cc571;
  }
  goto LAB_002cc576;
LAB_002cc571:
  pcVar4 = local_98._M_str;
  if (local_98._M_len == 0) goto LAB_002cc4f7;
LAB_002cc576:
  iface.device._M_dataplus._M_p = (pointer)&iface.device.field_2;
  iface.device._M_string_length = 0;
  iface.device.field_2._M_local_buf[0] = '\0';
  iface.ssl = false;
  iface.local = false;
  if (*pcVar4 == '[') {
    sVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::find(&local_98,']',0);
    if (((sVar3 == 0xffffffffffffffff) || (local_98._M_len <= sVar3 + 1)) ||
       (local_98._M_str[sVar3 + 1] != ':')) {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)err,&local_98)
      ;
      goto LAB_002cc768;
    }
    bVar7 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_98,1,sVar3 - 1);
    in_00._M_str = bVar7._M_str;
    in_00._M_len = (size_t)in_00._M_str;
    port_str._0_16_ = strip_string((aux *)bVar7._M_len,in_00);
    ::std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&iface,(basic_string_view<char,_std::char_traits<char>_> *)&port_str);
    bVar7 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_98,sVar3 + 2,0xffffffffffffffff);
  }
  else {
    sVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::find(&local_98,':',0);
    bVar7 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_98,0,sVar3);
    in_01._M_str = bVar7._M_str;
    in_01._M_len = (size_t)in_01._M_str;
    port_str._0_16_ = strip_string((aux *)bVar7._M_len,in_01);
    ::std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&iface,(basic_string_view<char,_std::char_traits<char>_> *)&port_str);
    if (sVar3 == 0xffffffffffffffff) {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)err,&local_98)
      ;
      goto LAB_002cc768;
    }
    bVar7 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_98,sVar3 + 1,0xffffffffffffffff);
  }
  in_02._M_str = bVar7._M_str;
  in_02._M_len = (size_t)in_02._M_str;
  sVar8 = strip_string((aux *)bVar7._M_len,in_02);
  port_str._M_string_length = 0;
  port_str._M_dataplus._M_p = (pointer)&port_str.field_2;
  port_str.field_2._M_local_buf[0] = '\0';
  for (sVar5 = 0; (sVar8._M_len != sVar5 && ((byte)(sVar8._M_str[sVar5] - 0x30U) < 10));
      sVar5 = sVar5 + 1) {
    ::std::__cxx11::string::push_back((char)&port_str);
  }
  sVar1 = port_str._M_string_length;
  if (port_str._M_string_length - 6 < 0xfffffffffffffffb) {
LAB_002cc6f3:
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)err,&local_98);
  }
  else {
    iface.port = atoi(port_str._M_dataplus._M_p);
    if (0xffff < (uint)iface.port) goto LAB_002cc6f3;
    in_03._M_str = extraout_RDX_00;
    in_03._M_len = (size_t)(sVar8._M_str + sVar1);
    sVar8 = strip_string((aux *)(sVar8._M_len - sVar1),in_03);
    for (sVar5 = 0; sVar8._M_len != sVar5; sVar5 = sVar5 + 1) {
      if (sVar8._M_str[sVar5] == 'l') {
        iface.local = true;
      }
      else if (sVar8._M_str[sVar5] == 's') {
        iface.ssl = true;
      }
    }
    ::std::
    vector<libtorrent::aux::listen_interface_t,std::allocator<libtorrent::aux::listen_interface_t>>
    ::emplace_back<libtorrent::aux::listen_interface_t&>(local_88,&iface);
  }
  ::std::__cxx11::string::~string((string *)&port_str);
LAB_002cc768:
  ::std::__cxx11::string::~string((string *)&iface);
  goto LAB_002cc4f7;
}

Assistant:

std::vector<listen_interface_t> parse_listen_interfaces(std::string const& in
		, std::vector<std::string>& err)
	{
		std::vector<listen_interface_t> out;

		string_view rest = in;
		while (!rest.empty())
		{
			string_view element;
			std::tie(element, rest) = split_string_quotes(rest, ',');

			element = strip_string(element);
			if (element.size() > 1 && element.front() == '"' && element.back() == '"')
				element = element.substr(1, element.size() - 2);
			if (element.empty()) continue;

			listen_interface_t iface;
			iface.ssl = false;
			iface.local = false;

			string_view port;
			if (element.front() == '[')
			{
				auto const pos = element.find_first_of(']', 0);
				if (pos == string_view::npos
					|| pos+1 >= element.size()
					|| element[pos+1] != ':')
				{
					err.emplace_back(element);
					continue;
				}

				iface.device = strip_string(element.substr(1, pos - 1));

				port = strip_string(element.substr(pos + 2));
			}
			else
			{
				// consume device name
				auto const pos = element.find_first_of(':', 0);
				iface.device = strip_string(element.substr(0, pos));
				if (pos == string_view::npos)
				{
					err.emplace_back(element);
					continue;
				}
				port = strip_string(element.substr(pos + 1));
			}

			// consume port
			std::string port_str;
			for (std::size_t i = 0; i < port.size() && is_digit(port[i]); ++i)
				port_str += port[i];

			if (port_str.empty() || port_str.size() > 5)
			{
				err.emplace_back(element);
				continue;
			}

			iface.port = std::atoi(port_str.c_str());
			if (iface.port < 0 || iface.port > 65535)
			{
				err.emplace_back(element);
				continue;
			}

			port.remove_prefix(port_str.size());
			port = strip_string(port);

			// consume potential SSL 's'
			for (auto const c : port)
			{
				switch (c)
				{
					case 's': iface.ssl = true; break;
					case 'l': iface.local = true; break;
				}
			}

			TORRENT_ASSERT(iface.port >= 0);
			out.emplace_back(iface);
		}

		return out;
	}